

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

int nullcInitTypeinfoModule(void)

{
  bool bVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (nullcInitTypeinfoModule::token == '\0') {
    iVar2 = __cxa_guard_acquire(&nullcInitTypeinfoModule::token);
    if (iVar2 != 0) {
      nullcInitTypeinfoModule::token = NULLC::TraceGetToken("nullc","nullcInitTypeinfoModule");
      __cxa_guard_release(&nullcInitTypeinfoModule::token);
    }
  }
  NULLC::TraceScope::TraceScope(&TStack_18,nullcInitTypeinfoModule::token);
  bVar1 = nullcInitTypeinfoModule(NULLC::linker);
  NULLC::TraceScope::~TraceScope(&TStack_18);
  return (uint)bVar1;
}

Assistant:

int nullcInitTypeinfoModule()
{
	TRACE_SCOPE("nullc", "nullcInitTypeinfoModule");

	return nullcInitTypeinfoModule(NULLC::linker);
}